

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O0

DecodeStatus DecodeGPRnopcRegisterClass(MCInst *Inst,uint RegNo,uint64_t Address,void *Decoder)

{
  DecodeStatus In;
  DecodeStatus local_2c;
  void *pvStack_28;
  DecodeStatus S;
  void *Decoder_local;
  uint64_t Address_local;
  MCInst *pMStack_10;
  uint RegNo_local;
  MCInst *Inst_local;
  
  local_2c = MCDisassembler_Success;
  if (RegNo == 0xf) {
    local_2c = MCDisassembler_SoftFail;
  }
  pvStack_28 = Decoder;
  Decoder_local = (void *)Address;
  Address_local._4_4_ = RegNo;
  pMStack_10 = Inst;
  In = DecodeGPRRegisterClass(Inst,RegNo,Address,Decoder);
  Check(&local_2c,In);
  return local_2c;
}

Assistant:

static DecodeStatus DecodeGPRnopcRegisterClass(MCInst *Inst, unsigned RegNo,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;

	if (RegNo == 15) 
		S = MCDisassembler_SoftFail;

	Check(&S, DecodeGPRRegisterClass(Inst, RegNo, Address, Decoder));

	return S;
}